

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

int __thiscall
QAbstractScrollAreaScrollBarContainer::scrollBarLayoutIndex
          (QAbstractScrollAreaScrollBarContainer *this)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = (**(code **)(*(long *)&this->layout->super_QLayout + 200))();
  if (0 < iVar1) {
    iVar4 = 0;
    do {
      plVar2 = (long *)(**(code **)(*(long *)&this->layout->super_QLayout + 0xa8))
                                 (this->layout,iVar4);
      (**(code **)(*plVar2 + 0x68))(plVar2);
      lVar3 = QMetaObject::cast((QObject *)&QScrollBar::staticMetaObject);
      if (lVar3 != 0) {
        return iVar4;
      }
      iVar4 = iVar4 + 1;
    } while (iVar1 != iVar4);
  }
  return -1;
}

Assistant:

int QAbstractScrollAreaScrollBarContainer::scrollBarLayoutIndex() const
{
    const int layoutItemCount = layout->count();
    for (int i = 0; i < layoutItemCount; ++i) {
        if (qobject_cast<QScrollBar *>(layout->itemAt(i)->widget()))
            return i;
    }
    return -1;
}